

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_int.h
# Opt level: O0

void vec_int_resize(vec_int_t *p,uint new_size)

{
  int *piVar1;
  uint new_size_local;
  vec_int_t *p_local;
  
  p->size = new_size;
  if (p->cap < new_size) {
    piVar1 = (int *)realloc(p->data,(ulong)new_size << 2);
    p->data = piVar1;
    if (p->data == (int *)0x0) {
      __assert_fail("p->data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_int.h"
                    ,0x5e,"void vec_int_resize(vec_int_t *, unsigned int)");
    }
    p->cap = new_size;
  }
  return;
}

Assistant:

static inline void vec_int_resize(vec_int_t *p, unsigned new_size)
{
    p->size = new_size;
    if (p->cap >= new_size)
        return;
    p->data = satoko_realloc(int, p->data, new_size);
    assert(p->data != NULL);
    p->cap = new_size;
}